

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option_button.cpp
# Opt level: O3

void Am_Inter_For_Panel_Do_proc(Am_Object *command_obj)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *value;
  Am_Object panel;
  Am_Object parent_command;
  Am_Object new_object;
  Am_Object inter;
  Am_Object panel_command;
  Am_Object item_command;
  Am_Value cmd_obj_value;
  Am_Value new_value;
  Am_Value old_value;
  Am_Object item;
  Am_Object local_b0;
  Am_Object local_a8;
  Am_Object local_a0;
  Am_Object local_98;
  Am_Object local_90;
  Am_Object local_88;
  Am_Value local_80;
  Am_Value local_70;
  Am_Value local_60;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object local_20;
  Am_Object local_18;
  
  local_a0.data = (Am_Object_Data *)0x0;
  local_18.data = (Am_Object_Data *)0x0;
  local_88.data = (Am_Object_Data *)0x0;
  local_b0.data = (Am_Object_Data *)0x0;
  local_90.data = (Am_Object_Data *)0x0;
  local_a8.data = (Am_Object_Data *)0x0;
  Am_Object::Get_Object(&local_98,(Am_Slot_Key)command_obj,10);
  local_60.type = 0;
  local_60.value.wrapper_value = (Am_Wrapper *)0x0;
  local_70.type = 0;
  local_70.value.wrapper_value = (Am_Wrapper *)0x0;
  local_80.type = 0;
  local_80.value.wrapper_value = (Am_Wrapper *)0x0;
  bVar1 = Am_Object::Valid(&local_98);
  if (bVar1) {
    Am_Object::Get_Object(&local_20,(Am_Slot_Key)&local_98,10);
    Am_Object::operator=(&local_b0,&local_20);
    Am_Object::~Am_Object(&local_20);
    pAVar2 = Am_Object::Get(&local_b0,0x169,1);
    Am_Value::operator=(&local_60,pAVar2);
    Am_Object::Set(&local_b0,0x16c,&local_60,0);
    Am_Object::Am_Object(&local_28,&local_98);
    set_panel_value_from_inter_value(&local_28);
    Am_Object::~Am_Object(&local_28);
    pAVar2 = Am_Object::Get(&local_b0,0x169,1);
    Am_Value::operator=(&local_70,pAVar2);
    Am_Object::Set(command_obj,0x16c,&local_60,0);
    Am_Object::Set(command_obj,0x169,&local_70,0);
    pAVar2 = Am_Object::Get(&local_98,0x16a,0);
    Am_Object::operator=(&local_a0,pAVar2);
    bVar1 = Am_Object::Valid(&local_b0);
    if (bVar1) {
      pAVar2 = Am_Object::Get(&local_b0,0xc5,1);
      Am_Value::operator=(&local_80,pAVar2);
      if (local_80.type == 0xa001) {
        Am_Object::operator=(&local_90,&local_80);
        Am_Object::Am_Object(&local_30,&Am_Command);
        bVar1 = Am_Object::Is_Instance_Of(&local_90,&local_30);
        Am_Object::~Am_Object(&local_30);
        if (!bVar1) {
          Am_Object::operator=(&local_90,&Am_No_Object);
        }
      }
    }
    bVar1 = Am_Object::Valid(&local_a0);
    if (bVar1) {
      Am_Object::Am_Object(&local_38,&Am_Menu_In_Scrolling_Menu);
      bVar1 = Am_Object::Is_Instance_Of(&local_b0,&local_38);
      Am_Object::~Am_Object(&local_38);
      if (!bVar1) {
        pAVar2 = Am_Object::Get(&local_a0,0xc5,1);
        Am_Value::operator=(&local_80,pAVar2);
        if (local_80.type == 0xa001) {
          Am_Object::operator=(&local_88,&local_80);
          Am_Object::Am_Object(&local_40,&Am_Command);
          bVar1 = Am_Object::Is_Instance_Of(&local_88,&local_40);
          Am_Object::~Am_Object(&local_40);
          if (bVar1) {
            Am_Object::operator=(&local_18,&local_a0);
            Am_Object::operator=(&local_a8,&local_88);
            Am_Object::Am_Object(&local_48,&local_98);
            Am_Object::Am_Object(&local_50,&local_a0);
            bVar1 = inter_value_is_or_contains(&local_48,&local_50);
            Am_Object::~Am_Object(&local_50);
            Am_Object::~Am_Object(&local_48);
            if (bVar1) {
              pAVar2 = Am_Object::Get(&local_a0,0x1af,1);
              Am_Value::operator=(&local_70,pAVar2);
            }
            else {
              Am_Value::operator=(&local_70,0);
            }
          }
          else {
            Am_Object::operator=(&local_88,&Am_No_Object);
          }
        }
      }
    }
    bVar1 = Am_Object::Valid(&local_88);
    if (!bVar1) {
      bVar1 = Am_Object::Valid(&local_90);
      if (bVar1) {
        Am_Object::operator=(&local_a8,&local_90);
        pAVar2 = Am_Object::Get(&local_b0,0x169,1);
        Am_Value::operator=(&local_70,pAVar2);
      }
    }
    pAVar2 = Am_Object::Get(&local_a8,0x169,1);
    Am_Value::operator=(&local_60,pAVar2);
    Am_Object::Set(&local_a8,0x16c,&local_60,0);
    Am_Object::Set(&local_a8,0x169,&local_70,0);
    value = Am_Object::operator_cast_to_Am_Wrapper_(&local_a8);
    Am_Object::Set(command_obj,0x154,value,0);
  }
  Am_Value::~Am_Value(&local_80);
  Am_Value::~Am_Value(&local_70);
  Am_Value::~Am_Value(&local_60);
  Am_Object::~Am_Object(&local_98);
  Am_Object::~Am_Object(&local_a8);
  Am_Object::~Am_Object(&local_90);
  Am_Object::~Am_Object(&local_b0);
  Am_Object::~Am_Object(&local_88);
  Am_Object::~Am_Object(&local_18);
  Am_Object::~Am_Object(&local_a0);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, Am_Inter_For_Panel_Do,
                 (Am_Object command_obj))
{
  Am_Object new_object, item, item_command, panel, panel_command,
      parent_command;
  Am_Object inter = command_obj.Get_Owner(); // owner will be interactor
  Am_Value old_value, new_value, cmd_obj_value;
  if (inter.Valid()) {
    //get old_value
    panel = inter.Get_Owner(); // panel the interactor is in
    old_value = panel.Peek(Am_VALUE);
    panel.Set(Am_OLD_VALUE, old_value);
    set_panel_value_from_inter_value(inter);
    //set command_obj's slots
    new_value = panel.Peek(Am_VALUE);
    command_obj.Set(Am_OLD_VALUE, old_value);
    Am_INTER_TRACE_PRINT(Am_INTER_TRACE_SETTING,
                         "++ DO method setting the Am_VALUE of "
                             << command_obj << " to " << new_value);
    command_obj.Set(Am_VALUE, new_value);

    new_object = inter.Get(Am_INTERIM_VALUE);
    // new_object is a sub-widget (an individual button)
    if (panel.Valid()) {
      cmd_obj_value = panel.Peek(Am_COMMAND);
      if (cmd_obj_value.type == Am_OBJECT) {
        panel_command = cmd_obj_value;
        if (!(panel_command.Is_Instance_Of(Am_Command)))
          panel_command = Am_No_Object;
      }
    }

    if (new_object.Valid() &&
        !panel.Is_Instance_Of(Am_Menu_In_Scrolling_Menu)) {
      // for scrolling menus, don't ever want to use the sub-item's command
      // object's method
      cmd_obj_value = new_object.Peek(Am_COMMAND);
      if (cmd_obj_value.type == Am_OBJECT) {
        item_command = cmd_obj_value;
        if (item_command.Is_Instance_Of(Am_Command)) {
          item = new_object;
          parent_command = item_command;
          //set the value of the item_command to the item's label_or_id or 0
          if (inter_value_is_or_contains(inter, new_object))
            new_value = new_object.Peek(Am_LABEL_OR_ID);
          else
            new_value = 0;
        } else
          item_command = Am_No_Object; // wrong type object
      }
    }
    if (!item_command.Valid()) { //not in the item, try to find a global cmd
      if (panel_command.Valid()) {
        parent_command = panel_command;
        //set the value of the panel_command to be the same as the panel's
        new_value = panel.Peek(Am_VALUE);
      }
    }
    old_value = parent_command.Peek(Am_VALUE);
    parent_command.Set(Am_OLD_VALUE, old_value);
    Am_INTER_TRACE_PRINT(Am_INTER_TRACE_SETTING,
                         "++ DO method setting the Am_VALUE of parent "
                             << parent_command << " to " << new_value);
    parent_command.Set(Am_VALUE, new_value);

    // set my parent to either the item's or panel's command object
    command_obj.Set(Am_IMPLEMENTATION_PARENT, parent_command);
  }
}